

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  bool collapse;
  int iVar5;
  pointer __rhs;
  char *local_268 [4];
  string filePrefix;
  string localToplevel;
  string rp;
  string dir;
  ostringstream cmCPackLog_msg;
  string local_50;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"   - packaging component: ");
  poVar3 = std::operator<<(poVar3,(string *)component);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x34,localToplevel._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&localToplevel);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&dir);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&localToplevel,pcVar4,(allocator *)&filePrefix);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&component->Name);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&dir,(SystemTools *)0x1,collapse);
  cmsys::SystemTools::ChangeDirectory(&localToplevel);
  filePrefix._M_dataplus._M_p = (pointer)&filePrefix.field_2;
  filePrefix._M_string_length = 0;
  filePrefix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",(allocator *)&rp
            );
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_FILE_NAME",(allocator *)&rp);
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&filePrefix);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::append((char *)&filePrefix);
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator *)&rp);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (((pcVar4 != (char *)0x0) && (*pcVar4 == '/')) && (pcVar4[1] != '\0')) {
    std::__cxx11::string::append((char *)&filePrefix);
    std::__cxx11::string::append((char *)&filePrefix);
  }
  __rhs = (component->Files).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__rhs == (component->Files).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      cmsys::SystemTools::ChangeDirectory(&dir);
      iVar5 = 1;
LAB_00299733:
      std::__cxx11::string::~string((string *)&filePrefix);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&localToplevel);
      return iVar5;
    }
    std::operator+(&rp,&filePrefix,__rhs);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Adding file: ");
    poVar3 = std::operator<<(poVar3,(string *)&rp);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x4f,local_268[0]);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string((string *)&local_50,(string *)&rp);
    cmArchiveWrite::Add(archive,&local_50,0,(char *)0x0,false);
    std::__cxx11::string::~string((string *)&local_50);
    if ((archive->Error)._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"ERROR while packaging files: ");
      std::__cxx11::string::string((string *)local_268,(string *)&archive->Error);
      poVar3 = std::operator<<(poVar3,(string *)local_268);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)local_268);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x55,local_268[0]);
      std::__cxx11::string::~string((string *)local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&rp);
      iVar5 = 0;
      goto LAB_00299733;
    }
    std::__cxx11::string::~string((string *)&rp);
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(cmArchiveWrite& archive,
                             cmCPackComponent* component)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "   - packaging component: "
      << component->Name
      << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/"+ component->Name;
  std::string dir = cmSystemTools::GetCurrentWorkingDirectory();
  // Change to local toplevel
  cmSystemTools::ChangeDirectory(localToplevel);
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY"))
    {
    filePrefix = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    filePrefix += "/";
    }
  const char* installPrefix =
    this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if(installPrefix && installPrefix[0] == '/' && installPrefix[1] != 0)
    {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix+1;
    filePrefix += "/";
    }
  std::vector<std::string>::const_iterator fileIt;
  for (fileIt = component->Files.begin(); fileIt != component->Files.end();
       ++fileIt )
    {
    std::string rp = filePrefix + *fileIt;
    cmCPackLogger(cmCPackLog::LOG_DEBUG,"Adding file: "
                  << rp << std::endl);
    archive.Add(rp, 0, 0, false);
    if (!archive)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "ERROR while packaging files: "
            << archive.GetError()
            << std::endl);
      return 0;
      }
    }
  // Go back to previous dir
  cmSystemTools::ChangeDirectory(dir);
  return 1;
}